

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::pop_no_return
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  error *this_00;
  allocator local_31;
  string local_30;
  
  if (this->m_current != this->m_start) {
    domain_type::~domain_type(this->m_current + -1);
    this->m_current = this->m_current + -1;
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000H",&local_31);
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void pop_no_return()
		{
			if (empty())
				throw cov::error("E000H");
			(m_current - 1)->~T();
			--m_current;
		}